

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImVector_ImVec4 * ImVector_ImVec4_ImVector_ImVec4Vector(ImVector_ImVec4 *src)

{
  uint uVar1;
  ImVector_ImVec4 *pIVar2;
  ImVec4 *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImVec4 *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImVec4 *)0x0;
  uVar1 = src->Size;
  if (0 < (long)(int)uVar1) {
    uVar3 = 8;
    if (8 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImVec4 *)ImGui::MemAlloc(uVar3 << 4);
    if (pIVar2->Data != (ImVec4 *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 4);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(pIVar2->Data,src->Data,(long)(int)uVar1 << 4);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImVec4* ImVector_ImVec4_ImVector_ImVec4Vector(const ImVector_ImVec4 src)
{
    return IM_NEW(ImVector_ImVec4)(src);
}